

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

void __thiscall
World::Command(World *this,string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *arguments,Command_Source *from)

{
  command_handler_register *this_00;
  System_Command_Source *this_01;
  string local_68;
  string local_48;
  
  if (from == (Command_Source *)0x0) {
    this_01 = (System_Command_Source *)operator_new(0x10);
    System_Command_Source::System_Command_Source(this_01,this);
    from = (Command_Source *)this_01;
  }
  else {
    this_01 = (System_Command_Source *)0x0;
  }
  util::lowercase(&local_68,command);
  this_00 = Commands::command_handler_register_instance;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  Commands::command_handler_register::Handle(this_00,&local_48,arguments,from,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (this_01 != (System_Command_Source *)0x0) {
    (*(this_01->super_Command_Source)._vptr_Command_Source[8])(this_01);
  }
  return;
}

Assistant:

void World::Command(std::string command, const std::vector<std::string>& arguments, Command_Source* from)
{
	std::unique_ptr<System_Command_Source> system_source;

	if (!from)
	{
		system_source.reset(new System_Command_Source(this));
		from = system_source.get();
	}

	Commands::Handle(util::lowercase(command), arguments, from);
}